

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_wrapper.cc
# Opt level: O0

void __thiscall ipx::BasicLu::_FtranForUpdate(BasicLu *this,Int nzrhs,Int *bi,double *bx)

{
  lu_int lVar1;
  logic_error *this_00;
  Int status;
  double *in_stack_000001f0;
  lu_int *in_stack_000001f8;
  double *in_stack_00000200;
  lu_int *in_stack_00000208;
  double *in_stack_00000210;
  lu_int *in_stack_00000218;
  lu_int *in_stack_00000230;
  double *in_stack_00000238;
  lu_int in_stack_00000240;
  lu_int *in_stack_00000248;
  double *in_stack_00000250;
  lu_int *in_stack_00000258;
  lu_int *in_stack_00000260;
  double *in_stack_00000268;
  char in_stack_00000270;
  BasicLu *in_stack_ffffffffffffff60;
  
  while( true ) {
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x80944d);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x809463);
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x809479);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x809492);
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x8094a8);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x8094c1);
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x8094da);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x8094f1);
    lVar1 = basiclu_solve_for_update
                      (in_stack_00000218,in_stack_00000210,in_stack_00000208,in_stack_00000200,
                       in_stack_000001f8,in_stack_000001f0,in_stack_00000230,in_stack_00000238,
                       in_stack_00000240,in_stack_00000248,in_stack_00000250,in_stack_00000258,
                       in_stack_00000260,in_stack_00000268,in_stack_00000270);
    if (lVar1 != 1) break;
    Reallocate(in_stack_ffffffffffffff60);
  }
  if (lVar1 != 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"basiclu_solve_for_update (ftran without lhs) failed");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void BasicLu::_FtranForUpdate(Int nzrhs, const Int* bi, const double* bx) {
    Int status;
    for (;;) {
        status = basiclu_solve_for_update(istore_.data(), xstore_.data(),
                                          Li_.data(), Lx_.data(),
                                          Ui_.data(), Ux_.data(),
                                          Wi_.data(), Wx_.data(),
                                          nzrhs, bi, bx,
                                          nullptr, nullptr, nullptr, 'N');
        if (status != BASICLU_REALLOCATE)
            break;
        Reallocate();
    }
    if (status != BASICLU_OK)
        throw std::logic_error(
            "basiclu_solve_for_update (ftran without lhs) failed");
}